

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_setlocale(lua_State *L)

{
  char *str_00;
  GCstr *local_30;
  int local_24;
  int opt;
  char *str;
  GCstr *s;
  lua_State *L_local;
  
  local_30 = lj_lib_optstr(L,1);
  if (local_30 == (GCstr *)0x0) {
    local_30 = (GCstr *)0x0;
  }
  else {
    local_30 = local_30 + 1;
  }
  local_24 = lj_lib_checkopt(L,2,6,anon_var_dwarf_8c88a);
  if (local_24 == 0) {
    local_24 = 0;
  }
  else if (local_24 == 1) {
    local_24 = 1;
  }
  else if (local_24 == 2) {
    local_24 = 2;
  }
  else if (local_24 == 3) {
    local_24 = 3;
  }
  else if (local_24 == 4) {
    local_24 = 4;
  }
  else if (local_24 == 6) {
    local_24 = 6;
  }
  str_00 = setlocale(local_24,(char *)local_30);
  lua_pushstring(L,str_00);
  return 1;
}

Assistant:

LJLIB_CF(os_setlocale)
{
#if LJ_TARGET_PSVITA
  lua_pushliteral(L, "C");
#else
  GCstr *s = lj_lib_optstr(L, 1);
  const char *str = s ? strdata(s) : NULL;
  int opt = lj_lib_checkopt(L, 2, 6,
    "\5ctype\7numeric\4time\7collate\10monetary\1\377\3all");
  if (opt == 0) opt = LC_CTYPE;
  else if (opt == 1) opt = LC_NUMERIC;
  else if (opt == 2) opt = LC_TIME;
  else if (opt == 3) opt = LC_COLLATE;
  else if (opt == 4) opt = LC_MONETARY;
  else if (opt == 6) opt = LC_ALL;
  lua_pushstring(L, setlocale(opt, str));
#endif
  return 1;
}